

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

int __thiscall
mpt::object::const_iterator::select
          (const_iterator *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  const_iterator *pcVar1;
  undefined4 in_register_00000034;
  bool bVar2;
  uintptr_t pos_local;
  const_iterator *this_local;
  
  *(undefined8 *)this = 0;
  *(ulong *)(this + 8) = CONCAT44(in_register_00000034,__nfds);
  pcVar1 = (const_iterator *)(**(code **)**(undefined8 **)(this + 0x30))();
  bVar2 = -1 < (int)pcVar1;
  if (bVar2) {
    *(ulong *)(this + 0x38) = CONCAT44(in_register_00000034,__nfds);
    pcVar1 = this;
  }
  return (int)CONCAT71((int7)((ulong)pcVar1 >> 8),bVar2);
}

Assistant:

bool object::const_iterator::select(uintptr_t pos)
{
	_prop.name = 0;
	_prop.desc = (const char *) pos;
	if (_ref.property(&_prop) < 0) {
		return false;
	}
	_pos = pos;
	return true;
}